

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O0

_Bool XPKView_CreateCheckerboardPattern(void)

{
  int iVar1;
  int local_38;
  int local_34;
  int x_3;
  int x_2;
  int y_1;
  int x_1;
  int x;
  int y;
  int i;
  SDL_Color gray;
  SDL_Color white;
  int checker_h;
  int checker_w;
  
  app.checkerboard_rgba = (uint8_t *)calloc(4,0x400);
  if (app.checkerboard_rgba == (uint8_t *)0x0) {
    LPWarn("xpkview","couldn\'t malloc the checkerboard!");
    checker_h._3_1_ = false;
  }
  else {
    x = 0;
    for (x_1 = 0; x_1 < 0x10; x_1 = x_1 + 1) {
      for (y_1 = 0; y_1 < 0x10; y_1 = y_1 + 1) {
        app.checkerboard_rgba[x] = 0xff;
        app.checkerboard_rgba[x + 1] = 0xff;
        iVar1 = x + 3;
        app.checkerboard_rgba[x + 2] = 0xff;
        x = x + 4;
        app.checkerboard_rgba[iVar1] = 0xff;
      }
      for (x_2 = 0; x_2 < 0x10; x_2 = x_2 + 1) {
        app.checkerboard_rgba[x] = 0xf0;
        app.checkerboard_rgba[x + 1] = 0xf0;
        iVar1 = x + 3;
        app.checkerboard_rgba[x + 2] = 0xf0;
        x = x + 4;
        app.checkerboard_rgba[iVar1] = 0xf0;
      }
    }
    for (x_3 = 0; x_3 < 0x10; x_3 = x_3 + 1) {
      for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
        app.checkerboard_rgba[x] = 0xf0;
        app.checkerboard_rgba[x + 1] = 0xf0;
        iVar1 = x + 3;
        app.checkerboard_rgba[x + 2] = 0xf0;
        x = x + 4;
        app.checkerboard_rgba[iVar1] = 0xf0;
      }
      for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
        app.checkerboard_rgba[x] = 0xff;
        app.checkerboard_rgba[x + 1] = 0xff;
        iVar1 = x + 3;
        app.checkerboard_rgba[x + 2] = 0xff;
        x = x + 4;
        app.checkerboard_rgba[iVar1] = 0xff;
      }
    }
    checker_h._3_1_ = true;
  }
  return checker_h._3_1_;
}

Assistant:

static bool
XPKView_CreateCheckerboardPattern(void)
{
	int checker_w = 16;
	int checker_h = 16;
	SDL_Color white = (SDL_Color){255, 255, 255, 255};
	SDL_Color gray = (SDL_Color){240, 240, 240, 240};

	app.checkerboard_rgba = calloc(4, checker_w*checker_h*4);

	if (!app.checkerboard_rgba) {
		LPWarn(MSGPREFIX, "couldn't malloc the checkerboard!");
		return false;
	}

	int i = 0;

	/* Top row: WHITE, GRAY */
	for (int y = 0; y < checker_h; y++) {
		for (int x = 0; x < checker_w; x++) {
			app.checkerboard_rgba[i++] = white.r;
			app.checkerboard_rgba[i++] = white.g;
			app.checkerboard_rgba[i++] = white.b;
			app.checkerboard_rgba[i++] = white.a;
		}

		for (int x = 0; x < checker_w; x++) {
			app.checkerboard_rgba[i++] = gray.r;
			app.checkerboard_rgba[i++] = gray.g;
			app.checkerboard_rgba[i++] = gray.b;
			app.checkerboard_rgba[i++] = gray.a;
		}
	}

	/* Bottom row: GRAY, WHITE */
	for (int y = 0; y < checker_h; y++) {
		for (int x = 0; x < checker_w; x++) {
			app.checkerboard_rgba[i++] = gray.r;
			app.checkerboard_rgba[i++] = gray.g;
			app.checkerboard_rgba[i++] = gray.b;
			app.checkerboard_rgba[i++] = gray.a;
		}

		for (int x = 0; x < checker_w; x++) {
			app.checkerboard_rgba[i++] = white.r;
			app.checkerboard_rgba[i++] = white.g;
			app.checkerboard_rgba[i++] = white.b;
			app.checkerboard_rgba[i++] = white.a;
		}
	}

	return true;
}